

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSToken.cpp
# Opt level: O2

void __thiscall OSToken::~OSToken(OSToken *this)

{
  set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> *__x;
  _Base_ptr p_Var1;
  MutexFactory *this_00;
  _Self __tmp;
  set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> cleanUp;
  _Rb_tree<OSObject_*,_OSObject_*,_std::_Identity<OSObject_*>,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>
  local_50;
  
  (this->super_ObjectStoreToken)._vptr_ObjectStoreToken = (_func_int **)&PTR_setSOPIN_0019eb40;
  __x = &this->allObjects;
  std::
  _Rb_tree<OSObject_*,_OSObject_*,_std::_Identity<OSObject_*>,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>
  ::_Rb_tree(&local_50,&__x->_M_t);
  std::
  _Rb_tree<OSObject_*,_OSObject_*,_std::_Identity<OSObject_*>,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>
  ::clear(&__x->_M_t);
  for (p_Var1 = local_50._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &local_50._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    if (*(long **)(p_Var1 + 1) != (long *)0x0) {
      (**(code **)(**(long **)(p_Var1 + 1) + 8))();
    }
  }
  if (this->tokenDir != (Directory *)0x0) {
    (*this->tokenDir->_vptr_Directory[1])();
  }
  if (this->gen != (Generation *)0x0) {
    (*this->gen->_vptr_Generation[1])();
  }
  this_00 = MutexFactory::i();
  MutexFactory::recycleMutex(this_00,this->tokenMutex);
  if (this->tokenObject != (ObjectFile *)0x0) {
    (*(this->tokenObject->super_OSObject)._vptr_OSObject[1])();
  }
  std::
  _Rb_tree<OSObject_*,_OSObject_*,_std::_Identity<OSObject_*>,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>
  ::~_Rb_tree(&local_50);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->currentFiles)._M_t);
  std::
  _Rb_tree<OSObject_*,_OSObject_*,_std::_Identity<OSObject_*>,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>
  ::~_Rb_tree(&__x->_M_t);
  std::
  _Rb_tree<OSObject_*,_OSObject_*,_std::_Identity<OSObject_*>,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>
  ::~_Rb_tree(&(this->objects)._M_t);
  std::__cxx11::string::~string((string *)&this->tokenPath);
  return;
}

Assistant:

OSToken::~OSToken()
{
	// Clean up
	std::set<OSObject*> cleanUp = allObjects;
	allObjects.clear();

	for (std::set<OSObject*>::iterator i = cleanUp.begin(); i != cleanUp.end(); i++)
	{
		delete *i;
	}

	delete tokenDir;
	if (gen != NULL) delete gen;
	MutexFactory::i()->recycleMutex(tokenMutex);
	delete tokenObject;
}